

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkPrimal.cpp
# Opt level: O3

void __thiscall HEkkPrimal::removeNonbasicFreeColumn(HEkkPrimal *this)

{
  int iVar1;
  
  if (((char *)(long)this->variable_in)
      [(long)(this->ekk_instance_->basis_).nonbasicMove_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start] == '\0') {
    iVar1 = HSet::remove(&this->nonbasic_free_col_set,(char *)(long)this->variable_in);
    if ((char)iVar1 == '\0') {
      highsLogDev(&(this->ekk_instance_->options_->super_HighsOptionsStruct).log_options,kError,
                  "HEkkPrimal::phase1update failed to remove nonbasic free column %d\n",
                  (ulong)(uint)this->variable_in);
      return;
    }
  }
  return;
}

Assistant:

void HEkkPrimal::removeNonbasicFreeColumn() {
  bool remove_nonbasic_free_column =
      ekk_instance_.basis_.nonbasicMove_[variable_in] == 0;
  if (remove_nonbasic_free_column) {
    bool removed_nonbasic_free_column =
        nonbasic_free_col_set.remove(variable_in);
    if (!removed_nonbasic_free_column) {
      highsLogDev(ekk_instance_.options_->log_options, HighsLogType::kError,
                  "HEkkPrimal::phase1update failed to remove nonbasic free "
                  "column %" HIGHSINT_FORMAT "\n",
                  variable_in);
      assert(removed_nonbasic_free_column);
    }
  }
}